

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O1

int op_reply(lua_State *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  long n;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int *p;
  size_t data_len;
  size_t local_38;
  
  local_38 = 0;
  iVar3 = 1;
  pcVar4 = luaL_checklstring(L,1,&local_38);
  if (local_38 < 0x20) {
    lua_pushboolean(L,0);
  }
  else {
    n = (long)*(int *)(pcVar4 + 4);
    if ((pcVar4[0xc] & 2U) == 0) {
      iVar3 = *(int *)(pcVar4 + 0x18);
      iVar1 = *(int *)(pcVar4 + 0x1c);
      iVar8 = (int)local_38 + -0x20;
      iVar2 = lua_type(L,2);
      if (iVar2 == 5) {
        uVar7 = 1;
        if (4 < iVar8) {
          uVar7 = 1;
          p = (int *)(pcVar4 + 0x20);
          do {
            lua_pushlightuserdata(L,p);
            lua_rawseti(L,2,uVar7);
            iVar2 = *p;
            p = (int *)((long)p + (long)iVar2);
            iVar8 = iVar8 - iVar2;
            uVar7 = uVar7 + 1;
          } while (4 < iVar8);
        }
        iVar2 = iVar1 + 1;
        iVar6 = (int)uVar7;
        if (iVar6 == iVar2) {
          sVar5 = lua_rawlen(L,2);
          if (iVar6 <= (int)sVar5) {
            uVar7 = uVar7 & 0xffffffff;
            iVar9 = iVar6 + -1;
            do {
              lua_pushnil(L);
              lua_rawseti(L,2,uVar7);
              uVar7 = uVar7 + 1;
              iVar9 = iVar9 + 1;
            } while (iVar9 < (int)sVar5);
          }
        }
        else {
          lua_pushboolean(L,0);
          lua_pushinteger(L,n);
        }
        if (iVar6 != iVar2) {
          return 2;
        }
      }
      else if (3 < iVar8) {
        iVar8 = iVar8 - *(int *)(pcVar4 + 0x20);
      }
      if (iVar8 == 0) {
        lua_pushboolean(L,1);
        lua_pushinteger(L,n);
        if (iVar1 == 0) {
          lua_pushnil(L);
        }
        else {
          lua_pushlightuserdata(L,pcVar4 + 0x20);
        }
        if ((*(int *)(pcVar4 + 0x10) == 0) && (*(int *)(pcVar4 + 0x14) == 0)) {
          lua_pushnil(L);
        }
        else {
          lua_pushlstring(L,pcVar4 + 0x10,8);
        }
        lua_pushinteger(L,(long)iVar3);
        iVar3 = 5;
      }
      else {
        iVar3 = luaL_error(L,"Invalid result bson document");
      }
    }
    else {
      lua_pushboolean(L,0);
      lua_pushinteger(L,n);
      lua_pushlightuserdata(L,pcVar4 + 0x20);
      iVar3 = 3;
    }
  }
  return iVar3;
}

Assistant:

static int
op_reply(lua_State *L) {
	size_t data_len = 0;
	const char * data = luaL_checklstring(L,1,&data_len);
	struct {
//		int32_t length; // total message size, including this
		int32_t request_id; // identifier for this message
		int32_t response_id; // requestID from the original request
							// (used in reponses from db)
		int32_t opcode; // request type 
		int32_t flags;
		int32_t cursor_id[2];
		int32_t starting;
		int32_t number;
	} const *reply = (const void *)data;

	if (data_len < sizeof(*reply)) {
		lua_pushboolean(L, 0);
		return 1;
	}

	int id = little_endian(reply->response_id);
	int flags = little_endian(reply->flags);
	if (flags & REPLY_QUERYFAILURE) {
		lua_pushboolean(L,0);
		lua_pushinteger(L, id);
		lua_pushlightuserdata(L, (void *)(reply+1));
		return 3;
	}

	int starting_from = little_endian(reply->starting);
	int number = little_endian(reply->number);
	int sz = (int)data_len - sizeof(*reply);
	const uint8_t * doc = (const uint8_t *)(reply+1);

	if (lua_istable(L,2)) {
		int i = 1;
		while (sz > 4) {
			lua_pushlightuserdata(L, (void *)doc);
			lua_rawseti(L, 2, i);

			int32_t doc_len = get_length((document)doc);

			doc += doc_len;
			sz -= doc_len;

			++i;
		}
		if (i != number + 1) {
			lua_pushboolean(L,0);
			lua_pushinteger(L, id);
			return 2;
		}
		int c = lua_rawlen(L, 2);
		for (;i<=c;i++) {
			lua_pushnil(L);
			lua_rawseti(L, 2, i);
		}
	} else {
		if (sz >= 4) {
			sz -= get_length((document)doc);
		}
	}
	if (sz != 0) {
		return luaL_error(L, "Invalid result bson document");
	}
	lua_pushboolean(L,1);
	lua_pushinteger(L, id);
	if (number == 0)
		lua_pushnil(L);
	else
		lua_pushlightuserdata(L, (void *)(reply+1));
	if (reply->cursor_id[0] == 0 && reply->cursor_id[1]==0) {
		// closed cursor
		lua_pushnil(L);
	} else {
		lua_pushlstring(L, (const char *)(reply->cursor_id), 8);
	}
	lua_pushinteger(L, starting_from);

	return 5;
}